

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O2

void __thiscall QCommandLineParser::process(QCommandLineParser *this,QStringList *arguments)

{
  bool bVar1;
  byte bVar2;
  QCommandLineParserPrivate *pQVar3;
  QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString> *this_00;
  long in_FS_OFFSET;
  QString local_120;
  Data *local_108;
  char16_t *pcStack_100;
  qsizetype local_f8;
  QStringBuilder<QString,_QLatin1String> local_e8;
  QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString> local_c0;
  QString local_80;
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_char16_t> local_68
  ;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QCommandLineParserPrivate::parse(this->d,arguments);
  if (bVar1) {
    pQVar3 = this->d;
    if (pQVar3->builtinVersionOption == true) {
      local_68.a.a.a.d.d = (Data *)0x0;
      local_c0.a.a.d.d = (Data *)0x0;
      local_c0.a.a.d.ptr = (char16_t *)0x0;
      local_68.a.a.a.d.ptr = L"version";
      local_c0.a.a.d.size = 0;
      local_68.a.a.a.d.size = 7;
      bVar1 = isSet(this,(QString *)&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      this_00 = &local_c0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_00);
      if (bVar1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          showVersion((QCommandLineParser *)this_00);
        }
        goto LAB_0038f5b5;
      }
      pQVar3 = this->d;
    }
    bVar2 = pQVar3->builtinHelpOption;
    if ((bool)bVar2 == true) {
      local_68.a.a.a.d.d = (Data *)0x0;
      local_c0.a.a.d.d = (Data *)0x0;
      local_c0.a.a.d.ptr = (char16_t *)0x0;
      local_68.a.a.a.d.ptr = L"help";
      local_c0.a.a.d.size = 0;
      local_68.a.a.a.d.size = 4;
      bVar1 = isSet(this,(QString *)&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c0);
      if (bVar1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          QCommandLineParserPrivate::showHelp(this->d,0,false);
        }
        goto LAB_0038f5b5;
      }
      bVar2 = this->d->builtinHelpOption;
    }
    if ((bVar2 & 1) != 0) {
      local_68.a.a.a.d.d = (Data *)0x0;
      local_c0.a.a.d.d = (Data *)0x0;
      local_c0.a.a.d.ptr = (char16_t *)0x0;
      local_68.a.a.a.d.ptr = L"help-all";
      local_c0.a.a.d.size = 0;
      local_68.a.a.a.d.size = 8;
      bVar1 = isSet(this,(QString *)&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c0);
      if (bVar1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          QCommandLineParserPrivate::showHelp(this->d,0,true);
        }
        goto LAB_0038f5b5;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else {
    QCoreApplication::applicationName();
    local_e8.a.d.size = local_f8;
    local_e8.a.d.ptr = pcStack_100;
    local_e8.a.d.d = local_108;
    local_108 = (Data *)0x0;
    pcStack_100 = (char16_t *)0x0;
    local_f8 = 0;
    local_e8.b.m_size = 2;
    local_e8.b.m_data = ": ";
    errorText(&local_120,this);
    QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>::QStringBuilder
              (&local_c0,&local_e8,&local_120);
    QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>::QStringBuilder
              (&local_68.a,&local_c0);
    local_68.b = L'\n';
    QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QString>,_char16_t>::
    convertTo<QString>(&local_80,&local_68);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      showMessageAndExit(Error,&local_80,1);
    }
  }
LAB_0038f5b5:
  __stack_chk_fail();
}

Assistant:

void QCommandLineParser::process(const QStringList &arguments)
{
    if (!d->parse(arguments)) {
        showMessageAndExit(MessageType::Error,
                           QCoreApplication::applicationName() + ": "_L1 + errorText() + u'\n',
                           EXIT_FAILURE);
    }

    if (d->builtinVersionOption && isSet(QStringLiteral("version")))
        showVersion();

    if (d->builtinHelpOption && isSet(QStringLiteral("help")))
        d->showHelp(EXIT_SUCCESS, false);

    if (d->builtinHelpOption && isSet(QStringLiteral("help-all")))
        d->showHelp(EXIT_SUCCESS, true);
}